

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

void show_resolve_info(Curl_easy *data,Curl_dns_entry *dns)

{
  dynbuf *s;
  curl_trc_feat *pcVar1;
  _Bool _Var2;
  CURLcode CVar3;
  size_t sVar4;
  char *pcVar5;
  Curl_addrinfo *ai;
  dynbuf out [2];
  char buf [46];
  
  if (((data->set).field_0x8cd & 0x10) == 0) {
    return;
  }
  if (dns->hostname[0] == '\0') {
    return;
  }
  pcVar5 = dns->hostname;
  _Var2 = Curl_host_is_ipnum(pcVar5);
  if (_Var2) {
    return;
  }
  ai = dns->addr;
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) {
    if (dns->hostname[0] == '\0') {
      pcVar5 = "(none)";
    }
    Curl_infof(data,"Host %s:%d was resolved.",pcVar5,(ulong)(uint)dns->hostport);
  }
  Curl_dyn_init(out,0x400);
  Curl_dyn_init(out + 1,0x400);
  for (; ai != (Curl_addrinfo *)0x0; ai = ai->ai_next) {
    if ((ai->ai_family | 8U) == 10) {
      s = out + (ai->ai_family != 2);
      Curl_printable_address(ai,buf,0x2e);
      sVar4 = Curl_dyn_len(s);
      if (((sVar4 != 0) && (CVar3 = Curl_dyn_addn(s,", ",2), CVar3 != CURLE_OK)) ||
         (CVar3 = Curl_dyn_add(s,buf), CVar3 != CURLE_OK)) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))
           )) {
          Curl_infof(data,"too many IP, cannot show");
        }
        goto LAB_0012ec0c;
      }
    }
  }
  if (((data->set).field_0x8cd & 0x10) != 0) {
    pcVar1 = (data->state).feat;
    if ((pcVar1 == (curl_trc_feat *)0x0) || (0 < pcVar1->log_level)) {
      sVar4 = Curl_dyn_len(out + 1);
      if (sVar4 == 0) {
        pcVar5 = "(none)";
      }
      else {
        pcVar5 = Curl_dyn_ptr(out + 1);
      }
      Curl_infof(data,"IPv6: %s",pcVar5);
      if (((data->set).field_0x8cd & 0x10) == 0) goto LAB_0012ec0c;
    }
    pcVar1 = (data->state).feat;
    if ((pcVar1 == (curl_trc_feat *)0x0) || (0 < pcVar1->log_level)) {
      sVar4 = Curl_dyn_len(out);
      if (sVar4 == 0) {
        pcVar5 = "(none)";
      }
      else {
        pcVar5 = Curl_dyn_ptr(out);
      }
      Curl_infof(data,"IPv4: %s",pcVar5);
    }
  }
LAB_0012ec0c:
  Curl_dyn_free(out);
  Curl_dyn_free(out + 1);
  return;
}

Assistant:

static void show_resolve_info(struct Curl_easy *data,
                              struct Curl_dns_entry *dns)
{
  struct Curl_addrinfo *a;
  CURLcode result = CURLE_OK;
#ifdef CURLRES_IPV6
  struct dynbuf out[2];
#else
  struct dynbuf out[1];
#endif
  DEBUGASSERT(data);
  DEBUGASSERT(dns);

  if(!data->set.verbose ||
     /* ignore no name or numerical IP addresses */
     !dns->hostname[0] || Curl_host_is_ipnum(dns->hostname))
    return;

  a = dns->addr;

  infof(data, "Host %s:%d was resolved.",
        (dns->hostname[0] ? dns->hostname : "(none)"), dns->hostport);

  Curl_dyn_init(&out[0], 1024);
#ifdef CURLRES_IPV6
  Curl_dyn_init(&out[1], 1024);
#endif

  while(a) {
    if(
#ifdef CURLRES_IPV6
       a->ai_family == PF_INET6 ||
#endif
       a->ai_family == PF_INET) {
      char buf[MAX_IPADR_LEN];
      struct dynbuf *d = &out[(a->ai_family != PF_INET)];
      Curl_printable_address(a, buf, sizeof(buf));
      if(Curl_dyn_len(d))
        result = Curl_dyn_addn(d, ", ", 2);
      if(!result)
        result = Curl_dyn_add(d, buf);
      if(result) {
        infof(data, "too many IP, cannot show");
        goto fail;
      }
    }
    a = a->ai_next;
  }

#ifdef CURLRES_IPV6
  infof(data, "IPv6: %s",
        (Curl_dyn_len(&out[1]) ? Curl_dyn_ptr(&out[1]) : "(none)"));
#endif
  infof(data, "IPv4: %s",
        (Curl_dyn_len(&out[0]) ? Curl_dyn_ptr(&out[0]) : "(none)"));

fail:
  Curl_dyn_free(&out[0]);
#ifdef CURLRES_IPV6
  Curl_dyn_free(&out[1]);
#endif
}